

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall slang::parsing::Lexer::scanBlockComment(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  TriviaKind kind;
  
  bVar3 = tryApplyCommentHandler(this);
  if (!bVar3) {
LAB_002b5a69:
    do {
      bVar3 = false;
      while( true ) {
        pcVar2 = this->sourceBuffer;
        cVar1 = *pcVar2;
        if (-1 < cVar1) break;
        bVar4 = scanUTF8Char(this,bVar3);
        bVar3 = (bool)(bVar3 | !bVar4);
      }
      if (cVar1 != '\0') {
        if (cVar1 == '/') {
          if (pcVar2[1] == '*') {
            addDiag(this,(DiagCode)0xb0002,(long)pcVar2 - (long)this->originalBegin);
            this->sourceBuffer = this->sourceBuffer + 2;
            goto LAB_002b5a69;
          }
        }
        else if ((cVar1 == '*') && (pcVar2[1] == '/')) {
          this->sourceBuffer = pcVar2 + 2;
          goto LAB_002b5b0f;
        }
        this->sourceBuffer = pcVar2 + 1;
        goto LAB_002b5a69;
      }
      if (this->sourceEnd + -1 <= pcVar2) goto LAB_002b5afe;
      this->errorCount = this->errorCount + 1;
      addDiag(this,(DiagCode)0x50002,(long)pcVar2 - (long)this->originalBegin);
      this->sourceBuffer = this->sourceBuffer + 1;
    } while( true );
  }
  kind = DisabledText;
LAB_002b5b11:
  addTrivia(this,kind);
  return;
LAB_002b5afe:
  addDiag(this,(DiagCode)0x120002,(long)pcVar2 - (long)this->originalBegin);
LAB_002b5b0f:
  kind = BlockComment;
  goto LAB_002b5b11;
}

Assistant:

void Lexer::scanBlockComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            sawUTF8Error = false;
            if (c == '*' && peek(1) == '/') {
                advance(2);
                break;
            }
            else if (c == '/' && peek(1) == '*') {
                // nested block comments disallowed by the standard; ignore and continue
                addDiag(diag::NestedBlockComment, currentOffset());
                advance(2);
            }
            else if (c == '\0') {
                if (reallyAtEnd()) {
                    addDiag(diag::UnterminatedBlockComment, currentOffset());
                    break;
                }

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
                advance();
            }
            else {
                advance();
            }
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::BlockComment);
}